

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyTargetEnergyDeposition.h
# Opt level: O0

DirectedEnergyTargetEnergyDeposition * __thiscall
DIS::DirectedEnergyTargetEnergyDeposition::operator=
          (DirectedEnergyTargetEnergyDeposition *this,DirectedEnergyTargetEnergyDeposition *param_1)

{
  undefined2 uVar1;
  float fVar2;
  DirectedEnergyTargetEnergyDeposition *param_1_local;
  DirectedEnergyTargetEnergyDeposition *this_local;
  
  EntityID::operator=(&this->_targetEntityID,&param_1->_targetEntityID);
  uVar1 = *(undefined2 *)&param_1->field_0x2a;
  fVar2 = param_1->_peakIrradiance;
  this->_padding = param_1->_padding;
  *(undefined2 *)&this->field_0x2a = uVar1;
  this->_peakIrradiance = fVar2;
  return this;
}

Assistant:

class OPENDIS7_EXPORT DirectedEnergyTargetEnergyDeposition
{
protected:
  /** Unique ID of the target entity. */
  EntityID _targetEntityID; 

  /** padding */
  unsigned short _padding; 

  /** Peak irrandiance */
  float _peakIrradiance; 


 public:
    DirectedEnergyTargetEnergyDeposition();
    virtual ~DirectedEnergyTargetEnergyDeposition();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    EntityID& getTargetEntityID(); 
    const EntityID&  getTargetEntityID() const; 
    void setTargetEntityID(const EntityID    &pX);

    unsigned short getPadding() const; 
    void setPadding(unsigned short pX); 

    float getPeakIrradiance() const; 
    void setPeakIrradiance(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const DirectedEnergyTargetEnergyDeposition& rhs) const;
}